

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface_unittest.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::anon_unknown_0::CommandLineInterfaceTest_FeatureExtensionError_Test::
~CommandLineInterfaceTest_FeatureExtensionError_Test
          (CommandLineInterfaceTest_FeatureExtensionError_Test *this)

{
  CommandLineInterfaceTester::~CommandLineInterfaceTester((CommandLineInterfaceTester *)this);
  operator_delete(this,0x2e8);
  return;
}

Assistant:

TEST_F(CommandLineInterfaceTest, FeatureExtensionError) {
  CreateTempFile("google/protobuf/descriptor.proto",
                 google::protobuf::DescriptorProto::descriptor()->file()->DebugString());
  CreateTempFile("features.proto",
                 pb::TestInvalidFeatures::descriptor()->file()->DebugString());
  CreateTempFile("foo.proto",
                 R"schema(
    edition = "2023";
    import "features.proto";
    message Foo {
      int32 bar = 1;
      int32 baz = 2 [features.(pb.test_invalid).repeated_feature = 5];
    })schema");

  mock_generator_->set_feature_extensions(
      {GetExtensionReflection(pb::test_invalid)});

  Run("protocol_compiler --proto_path=$tmpdir --test_out=$tmpdir foo.proto");
  ExpectErrorSubstring(
      "Feature field pb.TestInvalidFeatures.repeated_feature is an unsupported "
      "repeated field");
}